

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O1

Am_Wrapper * popup_sub_win_undo_handler_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object main_window;
  Am_Object for_item;
  Am_Value v;
  Am_Object undo_handler;
  Am_Object local_30;
  Am_Object local_28;
  Am_Value local_20;
  Am_Object local_10;
  
  local_28.data = (Am_Object_Data *)0x0;
  local_30.data = (Am_Object_Data *)0x0;
  local_10.data = (Am_Object_Data *)0x0;
  pAVar2 = Am_Object::Get(self,0x1d3,0);
  Am_Object::operator=(&local_28,pAVar2);
  bVar1 = Am_Object::Valid(&local_28);
  if (bVar1) {
    local_20.type = 0;
    local_20.value.wrapper_value = (Am_Wrapper *)0x0;
    pAVar2 = Am_Object::Get(&local_28,0x68,1);
    Am_Value::operator=(&local_20,pAVar2);
    bVar1 = Am_Value::Valid(&local_20);
    if (bVar1) {
      Am_Object::operator=(&local_30,&local_20);
      bVar1 = Am_Object::Valid(&local_30);
      if (bVar1) {
        pAVar2 = Am_Object::Get(&local_30,0x174,1);
        Am_Value::operator=(&local_20,pAVar2);
        bVar1 = Am_Value::Valid(&local_20);
        if (bVar1) {
          Am_Object::operator=(&local_10,&local_20);
        }
      }
    }
    Am_Value::~Am_Value(&local_20);
  }
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_10);
  Am_Object::~Am_Object(&local_10);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_28);
  return pAVar3;
}

Assistant:

Am_Define_Object_Formula(popup_sub_win_undo_handler)
{
  Am_Object for_item, main_window, undo_handler;
  for_item = self.Get(Am_FOR_ITEM);
  if (for_item.Valid()) {
    Am_Value v;
    v = for_item.Peek(Am_WINDOW);
    if (v.Valid()) {
      main_window = v;
      if (main_window.Valid()) {
        v = main_window.Peek(Am_UNDO_HANDLER);
        if (v.Valid())
          undo_handler = v;
      }
    }
  }
  return undo_handler;
}